

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetExternalData(JsValueRef object,void **data)

{
  bool bVar1;
  JavascriptProxy *this;
  JsrtExternalObject *this_00;
  CustomExternalWrapperObject *this_01;
  void *pvVar2;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  void **data_local;
  JsValueRef object_local;
  
  if (object == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (data == (void **)0x0) {
    return JsErrorNullArgument;
  }
  __debugCheckNoException = (DebugCheckNoException)data;
  DebugCheckNoException::DebugCheckNoException(&local_28);
  data_local = (void **)object;
  while (bVar1 = Js::VarIs<Js::JavascriptProxy>(data_local), bVar1) {
    this = Js::UnsafeVarTo<Js::JavascriptProxy>(data_local);
    data_local = (void **)Js::JavascriptProxy::GetTarget(this);
  }
  bVar1 = Js::VarIs<JsrtExternalObject>(data_local);
  if (bVar1) {
    this_00 = Js::UnsafeVarTo<JsrtExternalObject>(data_local);
    pvVar2 = JsrtExternalObject::GetSlotData(this_00);
    *(void **)__debugCheckNoException = pvVar2;
  }
  else {
    bVar1 = Js::VarIs<Js::CustomExternalWrapperObject>(data_local);
    if (!bVar1) {
      *(undefined8 *)__debugCheckNoException = 0;
      object_local._4_4_ = JsErrorInvalidArgument;
      bVar1 = true;
      goto LAB_004048bb;
    }
    this_01 = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(data_local);
    pvVar2 = Js::CustomExternalWrapperObject::GetSlotData(this_01);
    *(void **)__debugCheckNoException = pvVar2;
  }
  bVar1 = false;
LAB_004048bb:
  local_28.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_28);
  if (!bVar1) {
    object_local._4_4_ = JsNoError;
  }
  return object_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetExternalData(_In_ JsValueRef object, _Out_ void **data)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(data);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            *data = Js::UnsafeVarTo<JsrtExternalObject>(object)->GetSlotData();
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            *data = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->GetSlotData();
        }
#endif
        else
        {
            *data = nullptr;
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetExternalData(_In_ JsValueRef object, _In_opt_ void *data)
{
    VALIDATE_JSREF(object);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            Js::UnsafeVarTo<JsrtExternalObject>(object)->SetSlotData(data);
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->SetSlotData(data);
        }
#endif
        else
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsCallFunction(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_opt_ JsValueRef *result)
{
    if(result != nullptr)
    {
        *result = nullptr;
    }